

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::SaveState(FunctionBody *this,ParseNodeFnc *pnodeFnc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodeFnc *pnodeFnc_local;
  FunctionBody *this_local;
  
  bVar2 = ParseableFunctionInfo::IsReparsed(&this->super_ParseableFunctionInfo);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xc33,"(!this->IsReparsed())","!this->IsReparsed()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = ParseNodeFnc::ChildCallsEval(pnodeFnc);
  SetChildCallsEval(this,bVar2);
  bVar2 = ParseNodeFnc::CallsEval(pnodeFnc);
  SetCallsEval(this,bVar2);
  bVar2 = ParseNodeFnc::HasReferenceableBuiltInArguments(pnodeFnc);
  SetHasReferenceableBuiltInArguments(this,bVar2);
  return;
}

Assistant:

void FunctionBody::SaveState(ParseNodeFnc * pnodeFnc)
    {
        Assert(!this->IsReparsed());
        this->SetChildCallsEval(!!pnodeFnc->ChildCallsEval());
        this->SetCallsEval(!!pnodeFnc->CallsEval());
        this->SetHasReferenceableBuiltInArguments(!!pnodeFnc->HasReferenceableBuiltInArguments());
    }